

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void computeFloor(DateTime *p)

{
  int iVar1;
  uint uVar2;
  char cVar3;
  
  iVar1 = p->D;
  if ((iVar1 < 0x1d) || ((0x15aaU >> (p->M & 0x1fU) & 1) != 0)) {
    cVar3 = '\0';
  }
  else if (p->M == 2) {
    uVar2 = p->Y;
    if ((uVar2 & 3) == 0) {
      if (((int)uVar2 % 100 != 0) || ((int)uVar2 % 400 == 0)) {
        cVar3 = (char)iVar1 + -0x1d;
        goto LAB_001a0f05;
      }
    }
    cVar3 = (char)iVar1 + -0x1c;
  }
  else {
    cVar3 = iVar1 == 0x1f;
  }
LAB_001a0f05:
  p->nFloor = cVar3;
  return;
}

Assistant:

static void computeFloor(DateTime *p){
  assert( p->validYMD || p->isError );
  assert( p->D>=0 && p->D<=31 );
  assert( p->M>=0 && p->M<=12 );
  if( p->D<=28 ){
    p->nFloor = 0;
  }else if( (1<<p->M) & 0x15aa ){
    p->nFloor = 0;
  }else if( p->M!=2 ){
    p->nFloor = (p->D==31);
  }else if( p->Y%4!=0 || (p->Y%100==0 && p->Y%400!=0) ){
    p->nFloor = p->D - 28;
  }else{
    p->nFloor = p->D - 29;
  }
}